

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsResub.c
# Opt level: O2

void Abc_NtkMfsUpdateNetwork(Mfs_Man_t *p,Abc_Obj_t *pObj,Vec_Ptr_t *vMfsFanins,Hop_Obj_t *pFunc)

{
  Abc_Obj_t *pObjNew;
  Abc_Obj_t *pFanin;
  int i;
  
  pObjNew = Abc_NtkCreateObj(pObj->pNtk,ABC_OBJ_NODE);
  (pObjNew->field_5).pData = pFunc;
  for (i = 0; i < vMfsFanins->nSize; i = i + 1) {
    pFanin = (Abc_Obj_t *)Vec_PtrEntry(vMfsFanins,i);
    Abc_ObjAddFanin(pObjNew,pFanin);
  }
  Abc_NtkUpdate(pObj,pObjNew,p->vLevels);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////
 
/**Function*************************************************************

  Synopsis    [Updates the network after resubstitution.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_NtkMfsUpdateNetwork( Mfs_Man_t * p, Abc_Obj_t * pObj, Vec_Ptr_t * vMfsFanins, Hop_Obj_t * pFunc )
{
    Abc_Obj_t * pObjNew, * pFanin;
    int k;
    // create the new node
    pObjNew = Abc_NtkCreateNode( pObj->pNtk );
    pObjNew->pData = pFunc;
    Vec_PtrForEachEntry( Abc_Obj_t *, vMfsFanins, pFanin, k )
        Abc_ObjAddFanin( pObjNew, pFanin );
    // replace the old node by the new node
//printf( "Replacing node " ); Abc_ObjPrint( stdout, pObj );
//printf( "Inserting node " ); Abc_ObjPrint( stdout, pObjNew );
    // update the level of the node
    Abc_NtkUpdate( pObj, pObjNew, p->vLevels );
}